

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::_::concat<kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
          (String *__return_storage_ptr__,_ *this,
          Delimited<kj::ArrayPtr<const_unsigned_char>_> *params)

{
  size_t size;
  size_type extraout_RDX;
  char *target;
  initializer_list<unsigned_long> nums;
  size_t local_60;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> local_58;
  
  local_60 = Delimited<kj::ArrayPtr<const_unsigned_char>_>::size
                       ((Delimited<kj::ArrayPtr<const_unsigned_char>_> *)this);
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x1;
  size = sum((_ *)&local_60,nums);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  local_58.array.ptr = *(uchar **)this;
  local_58.array.size_ = *(size_t *)(this + 8);
  local_58.delimiter.content.ptr = *(char **)(this + 0x10);
  local_58.delimiter.content.size_ = *(size_t *)(this + 0x18);
  local_58.stringified.ptr = *(CappedArray<char,_5UL> **)(this + 0x20);
  local_58.stringified.size_ = *(size_t *)(this + 0x28);
  local_58.stringified.disposer = *(ArrayDisposer **)(this + 0x30);
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  Delimited<kj::ArrayPtr<const_unsigned_char>_>::flattenTo(&local_58,target);
  Array<kj::CappedArray<char,_5UL>_>::~Array(&local_58.stringified);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}